

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_misc.cpp
# Opt level: O1

string * log_info<char[6]>(string *__return_storage_ptr__,char (*what) [6],level_enum logger_level)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  sinks_init_list sinks_list;
  logger oss_logger;
  ostringstream oss;
  string local_268;
  shared_ptr<spdlog::sinks::sink> local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_238;
  logger local_228;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1bc8;
  this[1]._M_use_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[3]._M_use_count = 0;
  this[3]._M_weak_count = 0;
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__sink_001b1c18;
  *(ostringstream **)&this[4]._M_use_count = local_1a0;
  *(undefined1 *)&this[5]._vptr__Sp_counted_base = 0;
  paVar1 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"oss","");
  local_248.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this + 1);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  sinks_list._M_len = 1;
  sinks_list._M_array = &local_248;
  local_248.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this;
  spdlog::logger::logger(&local_228,&local_268,sinks_list);
  if (local_248.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  LOCK();
  UNLOCK();
  local_268._M_dataplus._M_p = (pointer)paVar1;
  local_228._level.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)logger_level;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"%v","");
  (*local_228._vptr_logger[6])(&local_228,&local_268,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  spdlog::logger::log<>(&local_228,info,*what);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_268);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      &local_238) {
    operator_delete(local_248.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_228._vptr_logger = (_func_int **)&PTR__logger_001b0820;
  if (local_228._err_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_228._err_handler.super__Function_base._M_manager)
              ((_Any_data *)&local_228._err_handler,(_Any_data *)&local_228._err_handler,
               __destroy_functor);
  }
  if (local_228._formatter.super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228._formatter.
               super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&local_228._sinks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._name._M_dataplus._M_p != &local_228._name.field_2) {
    operator_delete(local_228._name._M_dataplus._M_p);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string log_info(const T &what, spdlog::level::level_enum logger_level = spdlog::level::info)
{

    std::ostringstream oss;
    auto oss_sink = std::make_shared<spdlog::sinks::ostream_sink_mt>(oss);

    spdlog::logger oss_logger("oss", oss_sink);
    oss_logger.set_level(logger_level);
    oss_logger.set_pattern("%v");
    oss_logger.info(what);

    return oss.str().substr(0, oss.str().length() - strlen(spdlog::details::os::default_eol));
}